

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

bool __thiscall relive::Player::hasSource(Player *this)

{
  bool bVar1;
  pointer piVar2;
  scoped_lock<std::recursive_mutex> local_18;
  scoped_lock<std::recursive_mutex> lock;
  Player *this_local;
  
  lock._M_device = (mutex_type *)this;
  piVar2 = std::unique_ptr<relive::Player::impl,_std::default_delete<relive::Player::impl>_>::
           operator->(&this->_impl);
  std::scoped_lock<std::recursive_mutex>::scoped_lock(&local_18,&piVar2->_mutex);
  piVar2 = std::unique_ptr<relive::Player::impl,_std::default_delete<relive::Player::impl>_>::
           operator->(&this->_impl);
  bVar1 = ghc::net::uri::empty(&piVar2->_source);
  std::scoped_lock<std::recursive_mutex>::~scoped_lock(&local_18);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool Player::hasSource() const
{
    std::scoped_lock lock{_impl->_mutex};
    return !_impl->_source.empty();
}